

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_e668::AudioState::getSync(AudioState *this)

{
  double dVar1;
  nanoseconds nVar2;
  nanoseconds nVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  iVar5 = 0;
  if (this->mMovie->mAVSyncType != Audio) {
    nVar2 = MovieState::getMasterClock(this->mMovie);
    nVar3 = getClockNoLock(this);
    dVar1 = (anonymous_namespace)::AudioAvgFilterCoeff;
    lVar6 = nVar2.__r - nVar3.__r;
    if (lVar6 - 10000000000U < 0xfffffffb57e83801) {
      (this->mClockDiffAvg).__r = 0.0;
    }
    else {
      dVar7 = ((double)lVar6 +
              (this->mClockDiffAvg).__r * (anonymous_namespace)::AudioAvgFilterCoeff * 1000000000.0)
              / 1000000000.0;
      (this->mClockDiffAvg).__r = dVar7;
      dVar7 = (1.0 - dVar1) * dVar7;
      if ((0.015 <= dVar7) || (iVar5 = 0, dVar7 <= -0.03)) {
        lVar4 = 50000000;
        if (lVar6 < 50000000) {
          lVar4 = lVar6;
        }
        iVar5 = (int)((((this->mCodecCtx)._M_t.
                        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                        .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate *
                      lVar4) / 1000000000);
      }
    }
  }
  return iVar5;
}

Assistant:

int AudioState::getSync()
{
    if(mMovie.mAVSyncType == SyncMaster::Audio)
        return 0;

    auto ref_clock = mMovie.getMasterClock();
    auto diff = ref_clock - getClockNoLock();

    if(!(diff < AVNoSyncThreshold && diff > -AVNoSyncThreshold))
    {
        /* Difference is TOO big; reset accumulated average */
        mClockDiffAvg = seconds_d64::zero();
        return 0;
    }

    /* Accumulate the diffs */
    mClockDiffAvg = mClockDiffAvg*AudioAvgFilterCoeff + diff;
    auto avg_diff = mClockDiffAvg*(1.0 - AudioAvgFilterCoeff);
    if(avg_diff < AudioSyncThreshold/2.0 && avg_diff > -AudioSyncThreshold)
        return 0;

    /* Constrain the per-update difference to avoid exceedingly large skips */
    diff = std::min<nanoseconds>(diff, AudioSampleCorrectionMax);
    return static_cast<int>(duration_cast<seconds>(diff*mCodecCtx->sample_rate).count());
}